

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int need_value(FuncState *fs,int list)

{
  Instruction *pIVar1;
  
  while( true ) {
    if (list == -1) {
      return 0;
    }
    pIVar1 = getjumpcontrol(fs,list);
    if ((*pIVar1 & 0x3f) != 0x1b) break;
    list = getjump(fs,list);
  }
  return 1;
}

Assistant:

static int need_value(FuncState*fs,int list){
for(;list!=(-1);list=getjump(fs,list)){
Instruction i=*getjumpcontrol(fs,list);
if(GET_OPCODE(i)!=OP_TESTSET)return 1;
}
return 0;
}